

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzP.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzP::ChNodeFEAxyzP(ChNodeFEAxyzP *this,void **vtt,ChNodeFEAxyzP *other)

{
  undefined1 *this_00;
  _func_int **pp_Var1;
  double dVar2;
  
  pp_Var1 = (_func_int **)vtt[1];
  this_00 = &(this->super_ChNodeFEAbase).field_0x18;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = pp_Var1;
  *(void **)((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase + (long)pp_Var1[-3]) = vtt[2];
  (this->super_ChNodeFEAbase).g_index = (other->super_ChNodeFEAbase).g_index;
  (this->super_ChNodeFEAbase).m_TotalMass = (other->super_ChNodeFEAbase).m_TotalMass;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = pp_Var1;
  *(void **)((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase + (long)pp_Var1[-3]) = vtt[3];
  ChVariablesGeneric::ChVariablesGeneric((ChVariablesGeneric *)this_00,1);
  (this->pos).m_data[2] = 0.0;
  (this->pos).m_data[0] = 0.0;
  (this->pos).m_data[1] = 0.0;
  if (other != this) {
    (this->pos).m_data[0] = (other->pos).m_data[0];
    (this->pos).m_data[1] = (other->pos).m_data[1];
    (this->pos).m_data[2] = (other->pos).m_data[2];
  }
  dVar2 = other->P_dt;
  this->P = other->P;
  this->P_dt = dVar2;
  this->F = other->F;
  ChVariablesGeneric::operator=
            ((ChVariablesGeneric *)this_00,
             (ChVariablesGeneric *)&(other->super_ChNodeFEAbase).field_0x18);
  return;
}

Assistant:

ChNodeFEAxyzP::ChNodeFEAxyzP(const ChNodeFEAxyzP& other) : ChNodeFEAbase(other) {
    pos = other.pos;
    P = other.P;
    P_dt = other.P_dt;
    F = other.F;
    variables = other.variables;
}